

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADAFWSkew.h
# Opt level: O1

int __thiscall
COLLADAFW::Skew::clone(Skew *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  ObjectId OVar1;
  Real RVar2;
  undefined8 *puVar3;
  
  puVar3 = (undefined8 *)operator_new(0x60);
  *puVar3 = &PTR__Animatable_009348f0;
  OVar1 = (this->super_Transformation).super_Animatable.mAnimationList.mObjectId;
  puVar3[1] = *(undefined8 *)&(this->super_Transformation).super_Animatable.mAnimationList;
  puVar3[2] = OVar1;
  puVar3[3] = (this->super_Transformation).super_Animatable.mAnimationList.mFileId;
  *puVar3 = &PTR__Transformation_009e21e8;
  *(TransformationType *)(puVar3 + 4) = (this->super_Transformation).mTransformationType;
  *puVar3 = &PTR__Transformation_009dc188;
  RVar2 = (this->mRotateAxis).field_0.field_0.y;
  puVar3[5] = (this->mRotateAxis).field_0.field_0.x;
  puVar3[6] = RVar2;
  RVar2 = (this->mTranslateAxis).field_0.field_0.x;
  puVar3[7] = (this->mRotateAxis).field_0.field_0.z;
  puVar3[8] = RVar2;
  RVar2 = (this->mTranslateAxis).field_0.field_0.z;
  puVar3[9] = (this->mTranslateAxis).field_0.field_0.y;
  puVar3[10] = RVar2;
  *(float *)(puVar3 + 0xb) = this->mAngle;
  return (int)puVar3;
}

Assistant:

virtual Skew* clone() const { return new Skew(*this); }